

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove_if.c
# Opt level: O2

void linkedlist_remove_if
               (s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg,
               f_destroy_element destroy_element)

{
  s_linkedlist_node *psVar1;
  s_linkedlist_node *psVar2;
  e_matcher_result eVar3;
  s_linkedlist_node **ppsVar4;
  s_linkedlist_node *psVar5;
  s_linkedlist_node *__ptr;
  
  __ptr = linked_list->head;
  while (__ptr != (s_linkedlist_node *)0x0) {
    eVar3 = (*matcher)(__ptr->element,matcher_arg);
    if (eVar3 == E_MATCHER_RESULT_MATCH) {
      psVar1 = __ptr->previous;
      psVar2 = __ptr->next;
      ppsVar4 = &psVar1->next;
      if (psVar1 == (s_linkedlist_node *)0x0) {
        ppsVar4 = &linked_list->head;
      }
      psVar5 = psVar2;
      if (psVar2 == (s_linkedlist_node *)0x0) {
        psVar5 = (s_linkedlist_node *)&linked_list->tail;
      }
      *ppsVar4 = psVar2;
      psVar5->previous = psVar1;
      if (destroy_element != (f_destroy_element)0x0) {
        (*destroy_element)(psVar2->element);
      }
      free(__ptr);
      linked_list->size = linked_list->size - 1;
      __ptr = psVar2;
    }
    else {
      __ptr = __ptr->next;
    }
  }
  return;
}

Assistant:

void
linkedlist_remove_if(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg, f_destroy_element destroy_element) {
    s_linkedlist_node *node      = linked_list->head;
    s_linkedlist_node *to_delete = NULL;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            to_delete = node;
            node      = to_delete->next;

            if (destroy_element != NULL) {
                destroy_element(node->element);
            }

            free(to_delete);
            linked_list->size -= 1;
        } else {
            node = node->next;
        }
    }
}